

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>::lerp
          (LightNodeImpl<embree::SceneGraph::PointLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  long lVar1;
  PointLight *pPVar2;
  PointLight *light0;
  _func_int **pp_Var3;
  LightNodeImpl<embree::SceneGraph::PointLight> *this_00;
  long *in_RDX;
  long in_RSI;
  LightNode *in_RDI;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>_> light1;
  PointLight *in_stack_fffffffffffffef8;
  PointLight *light1_00;
  PointLight local_70;
  PointLight **local_30;
  PointLight **local_28;
  PointLight **local_20;
  PointLight *local_10;
  PointLight *local_8;
  
  local_30 = (PointLight **)&local_70;
  if (*in_RDX == 0) {
    light0 = (PointLight *)0x0;
  }
  else {
    light0 = (PointLight *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo,0);
  }
  light1_00 = &local_70;
  local_10 = light0;
  local_8 = light1_00;
  pPVar2 = light0;
  if (light0 != (PointLight *)0x0) {
    lVar1 = *(long *)local_70._0_8_;
    local_70._0_8_ = light0;
    (**(code **)(lVar1 + 0x10))();
    pPVar2 = (PointLight *)local_70._0_8_;
  }
  local_70._0_8_ = pPVar2;
  pp_Var3 = (_func_int **)operator_new(0x1cbc77);
  this_00 = (LightNodeImpl<embree::SceneGraph::PointLight> *)(in_RSI + 0x70);
  local_28 = (PointLight **)&local_70;
  PointLight::lerp(light0,light1_00,(float)((ulong)pp_Var3 >> 0x20));
  LightNodeImpl(this_00,in_stack_fffffffffffffef8);
  (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
  local_70.I.field_0._8_8_ = pp_Var3;
  if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
  }
  local_20 = (PointLight **)&local_70;
  if ((PointLight *)local_70._0_8_ != (PointLight *)0x0) {
    (**(code **)(*(long *)local_70._0_8_ + 0x18))();
  }
  return (Ref<embree::SceneGraph::LightNode>)in_RDI;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }